

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O1

complex<double> zdotc(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 in_RAX;
  complex<double> *pcVar1;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  complex<double> *__z;
  long lVar3;
  ulong *puVar4;
  complex<double> cVar5;
  complex<double> cVar6;
  complex<double> local_40;
  
  cVar5._M_value._12_4_ = in_register_00000014;
  cVar5._M_value._8_4_ = incx;
  if (n < 1) {
    cVar5._M_value._0_8_ = in_RAX;
    return (complex<double>)cVar5._M_value;
  }
  if (incy == 1 && incx == 1) {
    lVar3 = 0;
    do {
      local_40._M_value._0_8_ = *(undefined8 *)(cx->_M_value + lVar3);
      local_40._M_value._8_8_ = *(ulong *)(cx->_M_value + lVar3 + 8) ^ 0x8000000000000000;
      pcVar1 = std::complex<double>::operator*=(&local_40,(complex<double> *)(cy->_M_value + lVar3))
      ;
      lVar3 = lVar3 + 0x10;
      uVar2 = extraout_RDX;
    } while ((ulong)(uint)n << 4 != lVar3);
  }
  else {
    __z = cy + (incy >> 0x1f & (1 - n) * incy);
    puVar4 = (ulong *)(cx[incx >> 0x1f & (1 - n) * incx]._M_value + 8);
    do {
      local_40._M_value._0_8_ = puVar4[-1];
      local_40._M_value._8_8_ = *puVar4 ^ 0x8000000000000000;
      pcVar1 = std::complex<double>::operator*=(&local_40,__z);
      __z = __z + incy;
      puVar4 = puVar4 + (long)incx * 2;
      n = n + -1;
      uVar2 = extraout_RDX_00;
    } while (n != 0);
  }
  cVar6._M_value._8_8_ = uVar2;
  cVar6._M_value._0_8_ = pcVar1;
  return (complex<double>)cVar6._M_value;
}

Assistant:

complex <double> zdotc ( int n, complex <double> cx[], int incx,
  complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZDOTC forms the conjugated dot product of two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <double> ZDOTC, the conjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <double> value;

  value = complex <double> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[i] ) * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[ix] ) * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}